

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.cxx
# Opt level: O2

string * __thiscall
FileParse::formatDouble_abi_cxx11_
          (string *__return_storage_ptr__,FileParse *this,double value,int precision,
          double scientificLowerBound,double scientificUpperBound)

{
  size_type sVar1;
  uint uVar2;
  bool useScientific;
  ostringstream tempStream;
  long local_190 [2];
  uint auStack_180 [88];
  
  useScientific =
       (bool)(value != 0.0 &
             (-(ABS(value) < scientificLowerBound) | -(scientificUpperBound < ABS(value))));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&tempStream);
  uVar2 = 4;
  if (useScientific != false) {
    uVar2 = 0x100;
  }
  *(uint *)((long)auStack_180 + *(long *)(_tempStream + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(_tempStream + -0x18)) & 0xfffffefb | uVar2;
  *(long *)((long)local_190 + *(long *)(_tempStream + -0x18)) = (long)(int)this;
  std::ostream::_M_insert<double>(value);
  std::__cxx11::stringbuf::str();
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (__return_storage_ptr__,'.',0);
  if (sVar1 != 0xffffffffffffffff) {
    trimTrailingZeros(__return_storage_ptr__,useScientific);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tempStream);
  return __return_storage_ptr__;
}

Assistant:

std::string formatDouble(double value,
                      int precision,
                      double scientificLowerBound,
                      double scientificUpperBound)
    {
        bool useScientific = (std::abs(value) < scientificLowerBound || std::abs(value) > scientificUpperBound)
                             && value != 0.0;

        std::ostringstream tempStream;
        tempStream.setf(useScientific ? std::ios::scientific : std::ios::fixed, std::ios::floatfield);
        tempStream.precision(precision);
        tempStream << value;

        std::string str = tempStream.str();  // Get the formatted string

        // Trim trailing zeros if there is a decimal point in the string
        if (str.find('.') != std::string::npos)
        {
            trimTrailingZeros(str, useScientific);
        }

        return str;  // Return the final formatted string
    }